

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::Renderer_OGL10::SetDecalMode(Renderer_OGL10 *this,DecalMode *mode)

{
  DecalMode *mode_local;
  Renderer_OGL10 *this_local;
  
  if (*mode != this->nDecalMode) {
    switch(*mode) {
    case NORMAL:
      glBlendFunc(0x302,0x303);
      break;
    case ADDITIVE:
      glBlendFunc(0x302,1);
      break;
    case MULTIPLICATIVE:
      glBlendFunc(0x306,0x303);
      break;
    case STENCIL:
      glBlendFunc(0,0x302);
      break;
    case ILLUMINATE:
      glBlendFunc(0x303,0x302);
      break;
    case WIREFRAME:
      glBlendFunc(0x302,0x303);
    }
    this->nDecalMode = *mode;
  }
  return;
}

Assistant:

void SetDecalMode(const olc::DecalMode &mode)
		{
			if (mode != nDecalMode)
			{
				switch (mode)
				{
				case olc::DecalMode::NORMAL:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::ADDITIVE:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE);
					break;
				case olc::DecalMode::MULTIPLICATIVE:
					glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::STENCIL:
					glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::ILLUMINATE:
					glBlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::WIREFRAME:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				}

				nDecalMode = mode;
			}
		}